

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void runtime::printConstantArray<long>(ostream *out,vector<long,_std::allocator<long>_> *vec)

{
  pointer plVar1;
  pointer plVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  char local_31;
  
  plVar1 = (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  plVar2 = (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (plVar1 != plVar2) {
    lVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"| |",3);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"| ",2);
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      local_31 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
      lVar3 = lVar5 + 8;
      lVar5 = lVar5 + 8;
    } while ((pointer)((long)plVar1 + lVar3) != plVar2);
  }
  return;
}

Assistant:

void printConstantArray(std::ostream & out, const std::vector<T> & vec) {
  std::size_t i = 0;
  for (const auto& val : vec) {
    out << "| |" << i << "| " << val << '\n';
    i++;
  }
}